

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddBarrel
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,double Y_low
          ,double Y_high,double R_vert,double R_hor,double R_offset,ChVector<double> *pos,
          ChMatrix33<double> *rot)

{
  undefined1 auVar1 [16];
  ChCollisionShapeBullet *this_00;
  cbtBarrelShape *this_01;
  double dVar2;
  undefined8 in_XMM0_Qb;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  shared_ptr<chrono::ChMaterialSurface> local_38;
  
  dVar2 = Y_low;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])();
  auVar3._0_8_ = (double)SUB84(dVar2,0);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = R_vert;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = R_hor;
  auVar1 = vminsd_avx(auVar4,auVar1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = Y_high - Y_low;
  auVar1 = vminsd_avx(auVar1,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = auVar1._0_8_ * 0.15;
  auVar1 = vminsd_avx(auVar3,auVar5);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(auVar1._0_8_,this);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  local_38.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_38.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChCollisionShapeBullet::ChCollisionShapeBullet(this_00,BARREL,&local_38);
  if (local_38.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  dVar2 = (double)(this->super_ChCollisionModel).model_envelope;
  this_01 = (cbtBarrelShape *)cbtAlignedAllocInternal(0x58,0x10);
  cbtBarrelShape::cbtBarrelShape
            (this_01,(float)(Y_low - dVar2),(float)(dVar2 + Y_high),(float)(dVar2 + R_vert),
             (float)(dVar2 + R_hor),(float)R_offset);
  this_00->m_bt_shape = (cbtCollisionShape *)this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*(this_01->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xb])(this_01);
  injectShape(this,pos,rot,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddBarrel(std::shared_ptr<ChMaterialSurface> material,
                                       double Y_low,
                                       double Y_high,
                                       double R_vert,
                                       double R_hor,
                                       double R_offset,
                                       const ChVector<>& pos,
                                       const ChMatrix33<>& rot) {
    // adjust default inward margin (if object too thin)
    SetSafeMargin(ChMin(GetSafeMargin(), 0.15 * ChMin(ChMin(R_vert, R_hor), Y_high - Y_low)));

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::BARREL, material);

    cbtScalar sY_low = (cbtScalar)(Y_low - model_envelope);
    cbtScalar sY_high = (cbtScalar)(Y_high + model_envelope);
    cbtScalar sR_vert = (cbtScalar)(R_vert + model_envelope);
    cbtScalar sR_hor = (cbtScalar)(R_hor + model_envelope);
    cbtScalar sR_offset = (cbtScalar)(R_offset);
    shape->m_bt_shape = new cbtBarrelShape(sY_low, sY_high, sR_vert, sR_hor, sR_offset);
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, rot, shape);
    return true;
}